

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Activate_Size(FT_Size size)

{
  FT_Face pFVar1;
  FT_Error FVar2;
  
  if (size == (FT_Size)0x0) {
    FVar2 = 0x24;
  }
  else {
    pFVar1 = size->face;
    FVar2 = 0x23;
    if ((pFVar1 != (FT_Face)0x0) && (pFVar1->driver != (FT_Driver)0x0)) {
      pFVar1->size = size;
      return 0;
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Activate_Size( FT_Size  size )
  {
    FT_Face  face;


    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    face = size->face;
    if ( !face || !face->driver )
      return FT_THROW( Invalid_Face_Handle );

    /* we don't need anything more complex than that; all size objects */
    /* are already listed by the face                                  */
    face->size = size;

    return FT_Err_Ok;
  }